

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level_file.c
# Opt level: O3

int GetNormal(Edge *e,double *v1,double *v2)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_8_ = v2[1] - v1[1];
  e->a = auVar4._0_8_;
  dVar2 = *v2 - *v1;
  e->b = -dVar2;
  dVar3 = SQRT(auVar4._0_8_ * auVar4._0_8_ + dVar2 * dVar2);
  if (dVar3 >= 1.0) {
    auVar4._8_8_ = -dVar2;
    auVar1._8_4_ = SUB84(dVar3,0);
    auVar1._0_8_ = dVar3;
    auVar1._12_4_ = (int)((ulong)dVar3 >> 0x20);
    auVar4 = divpd(auVar4,auVar1);
    e->a = (double)auVar4._0_8_;
    e->b = (double)auVar4._8_8_;
    e->c = -(auVar4._0_8_ * *v1 + auVar4._8_8_ * v1[1]);
  }
  return (uint)(dVar3 < 1.0);
}

Assistant:

int GetNormal(struct Edge *e, double *v1, double *v2)
{
   /* get line normal */
   double length;

   e->a = v2[1] - v1[1];
   e->b = -(v2[0] - v1[0]);

   /* make line normal unit length */
   length = sqrt(e->a * e->a + e->b * e->b);
   if (length < 1.0f)
      return true;
   e->a /= length;
   e->b /= length;

   /* calculate distance of line from origin */
   e->c = -(v1[0] * e->a + v1[1] * e->b);
   return false;
}